

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColorPicker.cpp
# Opt level: O1

Vector3f anon_unknown.dwarf_3da977::convertHsvToRgb(Vector3f *hsv)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  Vector3f VVar6;
  
  fVar3 = hsv->y * hsv->z;
  fVar1 = hsv->z - fVar3;
  fVar2 = fmodf(hsv->x * 6.0,2.0);
  fVar3 = (1.0 - ABS(fVar2 + -1.0)) * fVar3;
  fVar2 = fVar1;
  fVar5 = fVar1;
  switch((int)(hsv->x * 6.0)) {
  case 0:
    fVar4 = hsv->z;
    fVar2 = fVar3 + fVar1;
    break;
  case 1:
    fVar4 = fVar3 + fVar1;
    fVar2 = hsv->z;
    break;
  case 2:
    fVar2 = hsv->z;
    fVar5 = fVar3 + fVar1;
    fVar4 = fVar1;
    break;
  case 3:
    fVar2 = fVar3 + fVar1;
    goto LAB_0018b838;
  case 4:
    fVar1 = fVar3 + fVar1;
LAB_0018b838:
    fVar5 = hsv->z;
    fVar4 = fVar1;
    break;
  default:
    fVar5 = fVar3 + fVar1;
    fVar4 = hsv->z;
  }
  VVar6.y = fVar2;
  VVar6.x = fVar4;
  VVar6.z = fVar5;
  return VVar6;
}

Assistant:

sf::Vector3f convertHsvToRgb(const sf::Vector3f& hsv) {
    float chroma = hsv.y * hsv.z;
    float m = hsv.z - chroma;
    float x = chroma * (1.0f - std::fabs(std::fmod(hsv.x * 6.0f, 2.0f) - 1.0f));

    int hueSection = static_cast<int>(hsv.x * 6.0f);
    switch(hueSection) {
    case 0:
        return {hsv.z, x + m, m};
    case 1:
        return {x + m, hsv.z, m};
    case 2:
        return {m, hsv.z, x + m};
    case 3:
        return {m, x + m, hsv.z};
    case 4:
        return {x + m, m, hsv.z};
    default:
        return {hsv.z, m, x + m};
    }
}